

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939_timedate_srv.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  libj1939_cmn *plVar4;
  ulong uVar5;
  ulonglong uVar6;
  void *pvVar7;
  char *__buf;
  tm *ptVar8;
  tm *ptVar9;
  ssize_t sVar10;
  ulong extraout_RAX;
  libj1939_cmn *cmn;
  epoll_event *peVar11;
  long lVar12;
  sockaddr *__addr;
  bool bVar13;
  epoll_event *peVar14;
  sockaddr_can peername;
  sockaddr_can addr;
  timespec ts;
  tm local_tm_buf;
  byte local_110;
  char local_10f;
  char local_10e;
  char local_10d;
  char local_10c;
  char local_10b;
  char local_10a;
  char local_109;
  epoll_event *local_108;
  int local_fc;
  libj1939_cmn *local_f8;
  undefined8 local_f0;
  epoll_event **local_e8;
  time_t local_e0;
  sockaddr local_d8;
  undefined8 local_c8;
  undefined1 local_b8 [64];
  timespec local_78;
  tm local_68;
  
  plVar4 = (libj1939_cmn *)calloc(1,0x68);
  if (plVar4 == (libj1939_cmn *)0x0) {
    err(1,"can\'t allocate priv");
  }
  local_e8 = &plVar4->epoll_events;
  local_f8 = plVar4;
  libj1939_init_sockaddr_can((sockaddr_can *)local_e8,0xea00);
  local_b8._0_8_ = (ulong)(uint)local_b8._4_4_ << 0x20;
  local_108 = (epoll_event *)0x0;
  local_f0 = 0;
  bVar13 = false;
  while( true ) {
    while (iVar2 = getopt_long(argc,argv,"a:n:i:",j1939_timedate_srv_parse_args_long_options,
                               local_b8), iVar2 == 0x69) {
      uVar3 = if_nametoindex(_optarg);
      *(uint *)((long)&plVar4->epoll_events + 4) = uVar3;
      bVar13 = true;
      if (uVar3 == 0) {
        main_cold_1();
        return -0x16;
      }
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x6e) {
      uVar6 = strtoull(_optarg,(char **)0x0,0x10);
      plVar4->epoll_events_size = uVar6;
      local_f0 = CONCAT71((int7)(uVar6 >> 8),1);
    }
    else {
      if (iVar2 != 0x61) {
        j1939_timedate_srv_print_help();
        return -0x16;
      }
      uVar5 = strtoul(_optarg,(char **)0x0,0x10);
      *(char *)((long)&(plVar4->next_send_time).tv_sec + 4) = (char)uVar5;
      local_108 = (epoll_event *)CONCAT71((int7)(uVar5 >> 8),1);
    }
  }
  if (!bVar13) {
    main_cold_2();
    return -0x16;
  }
  if (((byte)local_108 & (byte)local_f0 & 1) != 0) {
    main_cold_6();
    return -0x16;
  }
  clock_gettime(1,&local_78);
  plVar4[1].epoll_events_size = local_78.tv_sec;
  plVar4[1].next_send_time.tv_sec = local_78.tv_nsec;
  iVar2 = libj1939_create_epoll();
  if (iVar2 < 0) {
    return iVar2;
  }
  *(int *)&(plVar4->last_time).tv_nsec = iVar2;
  pvVar7 = calloc(10,0xc);
  *(void **)(plVar4 + 1) = pvVar7;
  if (pvVar7 == (void *)0x0) {
    return -0xc;
  }
  plVar4[1].epoll_events = (epoll_event *)0xa;
  local_b8._16_8_ = ((timespec *)(local_e8 + 2))->tv_sec;
  local_b8._0_8_ = *local_e8;
  local_b8._8_8_ = local_e8[1];
  iVar2 = libj1939_open_socket();
  if (iVar2 < 0) {
    return iVar2;
  }
  *(int *)&plVar4->field_0x4 = iVar2;
  iVar2 = libj1939_bind_socket(iVar2,(sockaddr_can *)local_b8);
  if (iVar2 < 0) {
    return iVar2;
  }
  iVar2 = libj1939_socket_prio(*(int *)&plVar4->field_0x4,6);
  if (iVar2 < 0) {
    return iVar2;
  }
  iVar2 = libj1939_set_broadcast(*(int *)&plVar4->field_0x4);
  if (iVar2 < 0) {
    return iVar2;
  }
  iVar2 = libj1939_add_socket_to_epoll
                    ((int)(plVar4->last_time).tv_nsec,*(int *)&plVar4->field_0x4,1);
  if (iVar2 != 0) {
    return iVar2;
  }
  cmn = (libj1939_cmn *)&(local_f8->last_time).tv_nsec;
  iVar2 = libj1939_prepare_for_events(cmn,&local_fc,false);
  do {
    if (iVar2 != 0) {
LAB_00102bb8:
      close((int)(plVar4->last_time).tv_nsec);
      free(*(void **)(plVar4 + 1));
      close(*(int *)&plVar4->field_0x4);
      close(plVar4->epoll_fd);
      return iVar2;
    }
    peVar14 = (epoll_event *)(long)local_fc;
    local_f8 = cmn;
    if (0 < (long)peVar14) {
      lVar12 = 4;
      peVar11 = (epoll_event *)0x0;
      local_108 = peVar14;
      do {
        if (plVar4[1].epoll_events <= peVar11) break;
        uVar3 = *(uint *)(*(long *)(plVar4 + 1) + -4 + lVar12);
        if (uVar3 == 0) {
          warn("no events");
        }
        else if ((uVar3 & 1) != 0) {
          iVar2 = *(int *)(*(long *)(plVar4 + 1) + lVar12);
          __buf = (char *)malloc(0x38);
          if (__buf == (char *)0x0) {
            main_cold_5();
            iVar2 = -0xc;
LAB_00102c4c:
            warn("recv one");
            goto LAB_00102bb8;
          }
          __buf[8] = '\b';
          __buf[9] = '\0';
          __buf[10] = '\0';
          __buf[0xb] = '\0';
          __buf[0xc] = '\0';
          __buf[0xd] = '\0';
          __buf[0xe] = '\0';
          __buf[0xf] = '\0';
          __buf[0x30] = '\x18';
          __buf[0x31] = '\0';
          __buf[0x32] = '\0';
          __buf[0x33] = '\0';
          *(int *)(__buf + 0x34) = iVar2;
          __addr = (sockaddr *)(__buf + 0x18);
          uVar5 = recvfrom(iVar2,__buf,8,0,__addr,(socklen_t *)(__buf + 0x30));
          peVar14 = local_108;
          uVar3 = (uint)uVar5;
          if ((int)uVar3 < 0) {
            main_cold_4();
            peVar14 = local_108;
            iVar2 = local_b8._0_4_;
LAB_00102a52:
            if (iVar2 != 0) goto LAB_00102c4c;
          }
          else {
            if (uVar3 < 3) {
              fprintf(_stderr,"received too short message: %i",uVar5 & 0xffffffff);
              iVar2 = -0x16;
              goto LAB_00102c4c;
            }
            *(ulong *)(__buf + 0x10) = (ulong)(uVar3 & 0x7fffffff);
            if (*(int *)(__buf + 0x28) == 0xea00) {
              if (((*__buf == -0x1a) && (__buf[1] == -2)) && (__buf[2] == '\0')) {
                local_c8 = *(undefined8 *)(__buf + 0x28);
                local_d8.sa_family = __addr->sa_family;
                local_d8.sa_data[0] = __addr->sa_data[0];
                local_d8.sa_data[1] = __addr->sa_data[1];
                local_d8.sa_data[2] = __addr->sa_data[2];
                local_d8.sa_data[3] = __addr->sa_data[3];
                local_d8.sa_data[4] = __addr->sa_data[4];
                local_d8.sa_data[5] = __addr->sa_data[5];
                local_d8.sa_data._6_8_ = *(undefined8 *)(__buf + 0x20);
                local_e0 = time((time_t *)0x0);
                ptVar8 = gmtime_r(&local_e0,(tm *)local_b8);
                ptVar9 = localtime_r(&local_e0,&local_68);
                peVar14 = local_108;
                local_10e = (char)ptVar8->tm_hour;
                local_109 = (char)ptVar9->tm_hour - local_10e;
                if (ptVar9->tm_mday != ptVar8->tm_mday) {
                  if (ptVar9->tm_hour < 0xc) {
                    local_109 = local_109 + '\x18';
                  }
                  else {
                    local_109 = local_109 + -0x18;
                  }
                }
                local_110 = (char)ptVar8->tm_sec << 2;
                if (0xee < local_110) {
                  local_110 = 0xef;
                }
                local_10a = (char)ptVar8->tm_min;
                local_10f = local_10a;
                if (0x3b < (ptVar8->tm_min & 0xfcU)) {
                  local_10f = ';';
                }
                if (0x17 < (ptVar8->tm_hour & 0xf8U)) {
                  local_10e = '\x17';
                }
                local_10c = (char)ptVar8->tm_mday * '\x04';
                if (local_10c < '\x02') {
                  local_10c = '\x01';
                }
                bVar1 = (byte)ptVar8->tm_mon;
                local_10d = bVar1 + 1;
                if (0xb < bVar1) {
                  local_10d = '\x01';
                }
                uVar3 = ptVar8->tm_year;
                if ((int)uVar3 < 0x55) {
                  local_10b = '\0';
                }
                else {
                  local_10b = -6;
                  if (uVar3 < 0x150) {
                    local_10b = (char)uVar3 + -0x55;
                  }
                }
                local_10a = (char)ptVar9->tm_min - local_10a;
                local_c8 = CONCAT44(local_c8._4_4_,0xfee6);
                sVar10 = sendto(*(int *)&plVar4->field_0x4,&local_110,8,0,&local_d8,0x18);
                if (((int)sVar10 == -1) && (main_cold_3(), (extraout_RAX & 1) == 0)) {
                  iVar2 = local_b8._0_4_;
                  goto LAB_00102a52;
                }
              }
            }
            else {
              fprintf(_stderr,"%s: unsupported PGN: %x","j1939_timedate_srv_rx_buf");
            }
          }
        }
        peVar11 = (epoll_event *)((long)&peVar11->events + 1);
        lVar12 = lVar12 + 0xc;
      } while (peVar14 != peVar11);
    }
    iVar2 = libj1939_prepare_for_events(local_f8,&local_fc,false);
    cmn = local_f8;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939_timedate_srv_priv *priv;
	struct timespec ts;
	int ret;

	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	bzero(priv, sizeof(*priv));

	libj1939_init_sockaddr_can(&priv->sockname, J1939_PGN_REQUEST_PGN);

	ret = j1939_timedate_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	ret = j1939_timedate_srv_sock_prepare(priv);
	if (ret)
		return ret;

	while (1) {
		ret = j1939_timedate_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);

	close(priv->sock_main);
	close(priv->sock_nack);

	return ret;
}